

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_map.c
# Opt level: O1

void nhr_map_delete(_nhr_map_node *map)

{
  _nhr_map_node_struct *p_Var1;
  _nhr_map_node *cur;
  
  if (map != (_nhr_map_node *)0x0) {
    do {
      p_Var1 = map->next;
      nhr_string_delete(map->key);
      if (map->value_type < 3) {
        nhr_free((map->value).data);
      }
      if (map->reserved_type < 3) {
        nhr_free((map->reserved).data);
      }
      nhr_free(map);
      map = p_Var1;
    } while (p_Var1 != (_nhr_map_node_struct *)0x0);
  }
  return;
}

Assistant:

void nhr_map_delete(_nhr_map_node * map) {
	_nhr_map_node *cur = map, *last;
	while (cur) {
		last = cur;
		cur = cur->next;
		nhr_string_delete(last->key);
		if (last->value_type <= NHR_MAP_VALUE_STRING) {
			nhr_free(last->value.data);
		}
        if (last->reserved_type <= NHR_MAP_VALUE_STRING) {
            nhr_free(last->reserved.data);
        }
		nhr_free(last);
	}
}